

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

lys_module * lys_schema_node_get_module(ly_ctx *ctx,char *prefix_dict,lysp_module *pmod)

{
  lysp_import *plVar1;
  char **ppcVar2;
  lysp_import **pplVar3;
  lysp_module *plVar4;
  ulong uVar5;
  char **ppcVar6;
  ulong uVar7;
  
  if (prefix_dict != (char *)0x0) {
    if ((pmod->field_0x79 & 2) == 0) {
      pplVar3 = (lysp_import **)&pmod->mod->prefix;
    }
    else {
      pplVar3 = &pmod[1].imports;
    }
    if (*pplVar3 != (lysp_import *)prefix_dict) {
      plVar1 = pmod->imports;
      uVar5 = 0xffffffffffffffff;
      ppcVar2 = &plVar1->prefix;
      while( true ) {
        ppcVar6 = ppcVar2;
        if (plVar1 == (lysp_import *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(ulong *)(plVar1[-1].rev + 6);
        }
        uVar5 = uVar5 + 1;
        if (uVar7 <= uVar5) break;
        ppcVar2 = ppcVar6 + 8;
        if (*ppcVar6 == prefix_dict) {
          return ((lysp_import *)(ppcVar6 + -2))->module;
        }
      }
      if ((pmod->field_0x79 & 2) == 0) {
        plVar4 = (lysp_module *)&pmod->mod->name;
      }
      else {
        plVar4 = pmod + 1;
      }
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
              "Invalid absolute-schema-nodeid nametest - prefix \"%s\" not defined in module \"%s\"."
              ,prefix_dict,plVar4->mod);
      return (lys_module *)0x0;
    }
  }
  return pmod->mod;
}

Assistant:

static const struct lys_module *
lys_schema_node_get_module(const struct ly_ctx *ctx, const char *prefix_dict, const struct lysp_module *pmod)
{
    const char *local_prefix;
    LY_ARRAY_COUNT_TYPE u;

    if (!prefix_dict) {
        /* local module */
        return pmod->mod;
    }

    local_prefix = pmod->is_submod ? ((struct lysp_submodule *)pmod)->prefix : pmod->mod->prefix;
    if (local_prefix == prefix_dict) {
        /* local module prefix */
        return pmod->mod;
    }

    LY_ARRAY_FOR(pmod->imports, u) {
        if (pmod->imports[u].prefix == prefix_dict) {
            /* import module prefix */
            return pmod->imports[u].module;
        }
    }

    /* prefix module not found */
    LOGVAL(ctx, LYVE_REFERENCE, "Invalid absolute-schema-nodeid nametest - prefix \"%s\" not defined in module \"%s\".",
            prefix_dict, LYSP_MODULE_NAME(pmod));
    return NULL;
}